

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void kmpc_set_poolsize(size_t size)

{
  int gtid;
  bget_release_t in_stack_00000008;
  bget_acquire_t in_stack_00000010;
  bget_compact_t in_stack_00000018;
  kmp_info_t *in_stack_00000020;
  
  gtid = __kmp_get_global_thread_id();
  __kmp_thread_from_gtid(gtid);
  bectl(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,size);
  return;
}

Assistant:

void kmpc_set_poolsize(size_t size) {
  bectl(__kmp_get_thread(), (bget_compact_t)0, (bget_acquire_t)malloc,
        (bget_release_t)free, (bufsize)size);
}